

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.h
# Opt level: O0

Request<capnp::RealmGateway<capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer>::ExportParams,_capnp::Persistent<capnp::AnyPointer,_capnp::AnyPointer>::SaveResults>
* __thiscall
capnp::Capability::Client::
newCall<capnp::RealmGateway<capnp::AnyPointer,capnp::AnyPointer,capnp::AnyPointer,capnp::AnyPointer>::ExportParams,capnp::Persistent<capnp::AnyPointer,capnp::AnyPointer>::SaveResults>
          (Request<capnp::RealmGateway<capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer>::ExportParams,_capnp::Persistent<capnp::AnyPointer,_capnp::AnyPointer>::SaveResults>
           *__return_storage_ptr__,Client *this,uint64_t interfaceId,uint16_t methodId,
          Maybe<capnp::MessageSize> *sizeHint)

{
  Builder builder;
  ClientHook *pCVar1;
  Own<capnp::RequestHook> *hook;
  BuilderFor<capnp::RealmGateway<>::ExportParams> local_a8;
  Maybe<capnp::MessageSize> local_70;
  undefined1 local_58 [8];
  Request<capnp::AnyPointer,_capnp::AnyPointer> typeless;
  Maybe<capnp::MessageSize> *sizeHint_local;
  uint16_t methodId_local;
  uint64_t interfaceId_local;
  Client *this_local;
  
  typeless.hook.ptr = (RequestHook *)sizeHint;
  pCVar1 = kj::Own<capnp::ClientHook>::operator->(&this->hook);
  kj::Maybe<capnp::MessageSize>::Maybe(&local_70,sizeHint);
  (**pCVar1->_vptr_ClientHook)(local_58,pCVar1,interfaceId,(ulong)methodId,&local_70);
  kj::Maybe<capnp::MessageSize>::~Maybe(&local_70);
  AnyPointer::Builder::
  getAs<capnp::RealmGateway<capnp::AnyPointer,capnp::AnyPointer,capnp::AnyPointer,capnp::AnyPointer>::ExportParams>
            (&local_a8,(Builder *)local_58);
  hook = kj::mv<kj::Own<capnp::RequestHook>>
                   ((Own<capnp::RequestHook> *)&typeless.super_Builder.builder.pointer);
  builder._builder.capTable = local_a8._builder.capTable;
  builder._builder.segment = local_a8._builder.segment;
  builder._builder.data = local_a8._builder.data;
  builder._builder.pointers = local_a8._builder.pointers;
  builder._builder.dataSize = local_a8._builder.dataSize;
  builder._builder.pointerCount = local_a8._builder.pointerCount;
  builder._builder._38_2_ = local_a8._builder._38_2_;
  Request<capnp::RealmGateway<capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer>::ExportParams,_capnp::Persistent<capnp::AnyPointer,_capnp::AnyPointer>::SaveResults>
  ::Request(__return_storage_ptr__,builder,hook);
  Request<capnp::AnyPointer,_capnp::AnyPointer>::~Request
            ((Request<capnp::AnyPointer,_capnp::AnyPointer> *)local_58);
  return __return_storage_ptr__;
}

Assistant:

inline Request<Params, Results> Capability::Client::newCall(
    uint64_t interfaceId, uint16_t methodId, kj::Maybe<MessageSize> sizeHint) {
  auto typeless = hook->newCall(interfaceId, methodId, sizeHint);
  return Request<Params, Results>(typeless.template getAs<Params>(), kj::mv(typeless.hook));
}